

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

bool __thiscall ON_3dmView::Read(ON_3dmView *this,ON_BinaryArchive *file)

{
  undefined8 uVar1;
  ON_3dPoint target_point;
  unsigned_short uVar2;
  unsigned_short uVar3;
  bool bVar4;
  ViewSectionBehavior VVar5;
  bool bVar6;
  v3_display_mode vVar7;
  uint uVar8;
  int iVar9;
  view_type vVar10;
  wchar_t *full_path;
  ON_UUID *pOVar11;
  uchar *puVar12;
  uchar c;
  int minor_version;
  int i32;
  int major_version;
  uint tcode;
  ON__INT64 big_value;
  ON_3dPoint obsolete_target_point;
  ON_BoundingBox obsolete_nested_view_position;
  ON_UUID obsolete_parent_viewport_id;
  byte local_141;
  int local_140;
  ON__INT32 local_13c;
  int local_138;
  uint local_134;
  ON__INT64 local_130;
  ON_UUID_struct *local_128;
  ON_3dmWallpaperImage *local_120;
  ON__INT32 *local_118;
  ON_2iSize *local_110;
  ON_FocalBlurModes *local_108;
  uint *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  bool *local_e0;
  ON_UUID *local_d8;
  ON_SimpleArray<ON_ClippingPlaneInfo> *local_d0;
  bool *local_c8;
  ON_3dmPageSettings *local_c0;
  double *local_b8;
  double *local_b0;
  ON_3dmConstructionPlane *local_a8;
  ON_3dmViewTraceImage *local_a0;
  ON_wString *local_98;
  ON_3dmViewPosition *local_90;
  ON_3dPoint local_88;
  ON_BoundingBox local_70;
  ON_UUID local_40;
  
  local_88.z = ON_3dPoint::UnsetPoint.z;
  local_88.x = ON_3dPoint::UnsetPoint.x;
  local_88.y = ON_3dPoint::UnsetPoint.y;
  local_134 = 0;
  local_130 = 0;
  Default(this);
  local_c0 = &this->m_page_settings;
  local_b0 = &(this->m_page_settings).m_width_mm;
  local_b8 = &(this->m_page_settings).m_height_mm;
  local_128 = &this->m_display_mode_id;
  local_c8 = &this->m_bLockedProjection;
  local_d0 = &this->m_clipping_planes;
  local_d8 = &this->m_named_view_id;
  local_e0 = &this->m_bShowConstructionZAxis;
  local_e8 = &this->m_dFocalBlurDistance;
  local_f0 = &this->m_dFocalBlurAperture;
  local_f8 = &this->m_dFocalBlurJitter;
  local_100 = &this->m_uFocalBlurSampleCount;
  local_108 = &this->m_FocalBlurMode;
  local_110 = &this->m_sizeRendering;
  local_118 = &(this->m_sizeRendering).cy;
  local_90 = &this->m_position;
  local_98 = &this->m_name;
  local_120 = &this->m_wallpaper_image;
  local_a0 = &this->m_trace_image;
  local_a8 = &this->m_cplane;
  bVar4 = true;
  do {
    if (bVar4 == false) break;
    bVar4 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_134,&local_130);
    if (!bVar4) {
      bVar4 = false;
      break;
    }
    bVar4 = true;
    if ((int)local_134 < 0x2000873b) {
      if ((int)local_134 < -0x5ffff6c5) {
        if (local_134 == 0xa000033b) {
          this->m_bShowConstructionGrid = local_130 != 0;
        }
        else if (local_134 == 0xa000043b) {
          this->m_bShowConstructionAxes = local_130 != 0;
        }
        else if (local_134 == 0xa000053b) {
          this->m_bShowWorldAxes = local_130 != 0;
        }
      }
      else if ((int)local_134 < 0x2000823b) {
        if (local_134 == 0xa000093b) {
          bVar6 = ::operator==(&ON_nil_uuid,local_128);
          if (bVar6) {
            local_13c = (int)local_130;
            vVar7 = ON::V3DisplayMode((int)local_130);
            uVar8 = vVar7 - v3_wireframe_display;
            if (uVar8 < 3) {
              pOVar11 = (ON_UUID *)(&PTR_Wireframe_00808f30)[uVar8];
              puVar12 = (&PTR_Wireframe_Data4_0__00808f48)[uVar8];
            }
            else {
              pOVar11 = &ON_nil_uuid;
              puVar12 = ON_nil_uuid.Data4;
            }
            uVar1 = *(undefined8 *)puVar12;
            uVar2 = pOVar11->Data2;
            uVar3 = pOVar11->Data3;
            (this->m_display_mode_id).Data1 = pOVar11->Data1;
            (this->m_display_mode_id).Data2 = uVar2;
            (this->m_display_mode_id).Data3 = uVar3;
            *(undefined8 *)(this->m_display_mode_id).Data4 = uVar1;
          }
        }
        else if (local_134 == 0x2000813b) {
          bVar4 = ON_3dmConstructionPlane::Read(local_a8,file);
        }
      }
      else if (local_134 == 0x2000823b) {
        bVar4 = ON_Viewport::Read(&this->m_vp,file);
      }
      else if (local_134 == 0x2000863b) {
        bVar4 = ON_3dmViewTraceImage::Read(local_a0,file);
      }
    }
    else if ((int)local_134 < 0x20008a3b) {
      if (local_134 == 0x2000873b) {
        ON_wString::ON_wString((ON_wString *)&local_70);
        bVar4 = ON_BinaryArchive::ReadString(file,(ON_wString *)&local_70);
        full_path = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_70);
        ON_FileReference::SetFullPath(&local_120->m_image_file_reference,full_path,false);
        ON_wString::~ON_wString((ON_wString *)&local_70);
        (this->m_wallpaper_image).m_bGrayScale = true;
      }
      else if (local_134 == 0x2000874b) {
        bVar4 = ON_3dmWallpaperImage::Read(local_120,file);
      }
      else if (local_134 == 0x2000883b) {
        bVar4 = ON_BinaryArchive::ReadPoint(file,&local_88);
      }
    }
    else if ((int)local_134 < 0x20008c3b) {
      if (local_134 == 0x20008a3b) {
        bVar4 = ON_BinaryArchive::ReadString(file,local_98);
      }
      else if (local_134 == 0x20008b3b) {
        bVar4 = ON_3dmViewPosition::Read(local_90,file);
      }
    }
    else if (local_134 == 0x20008c3b) {
      local_138 = 0;
      local_140 = 0;
      bVar4 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_138,&local_140);
      if ((((bVar4) && (local_138 == 1)) && (0 < local_140)) &&
         ((iVar9 = ON_BinaryArchive::Archive3dmVersion(file), 3 < iVar9 &&
          (uVar8 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), 0xbf36f81 < uVar8)))) {
        local_13c = 0;
        bVar4 = ON_BinaryArchive::ReadInt(file,&local_13c);
        if (bVar4) {
          vVar10 = ON::ViewType(local_13c);
          this->m_view_type = vVar10;
          bVar4 = ON_BinaryArchive::ReadDouble(file,local_b0);
          if (((bVar4) && (bVar4 = ON_BinaryArchive::ReadDouble(file,local_b8), bVar4)) &&
             (bVar4 = ON_BinaryArchive::ReadUuid(file,&local_40), bVar4)) {
            ON_BoundingBox::ON_BoundingBox(&local_70);
            bVar4 = ON_BinaryArchive::ReadBoundingBox(file,&local_70);
            if ((bVar4) && (1 < local_140)) {
              bVar4 = ON_BinaryArchive::ReadUuid(file,local_128);
              if (!bVar4) goto LAB_00378937;
              bVar4 = ON_3dmPageSettings::Read(local_c0,file);
              if (((((bVar4) && (2 < local_140)) &&
                   (bVar4 = ON_BinaryArchive::ReadBool(file,local_c8), bVar4)) &&
                  ((3 < local_140 && (bVar4 = ON_BinaryArchive::ReadArray(file,local_d0), bVar4))))
                 && ((((4 < local_140 &&
                       ((bVar4 = ON_BinaryArchive::ReadUuid(file,local_d8), bVar4 && (5 < local_140)
                        ))) && (bVar4 = ON_BinaryArchive::ReadBool(file,local_e0), bVar4)) &&
                     (6 < local_140)))) {
                bVar4 = ON_BinaryArchive::ReadDouble(file,local_e8);
                if ((((!bVar4) || (bVar4 = ON_BinaryArchive::ReadDouble(file,local_f0), !bVar4)) ||
                    (bVar4 = ON_BinaryArchive::ReadDouble(file,local_f8), !bVar4)) ||
                   ((bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)local_100), !bVar4 ||
                    (bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)local_108), !bVar4))))
                goto LAB_00378937;
                bVar4 = true;
                if (7 < local_140) {
                  bVar6 = ON_BinaryArchive::ReadInt(file,&local_110->cx);
                  if ((!bVar6) || (bVar6 = ON_BinaryArchive::ReadInt(file,local_118), !bVar6))
                  goto LAB_00378937;
                  if (8 < local_140) {
                    local_141 = 0;
                    bVar6 = ON_BinaryArchive::ReadChar(file,&local_141);
                    if (!bVar6) goto LAB_00378937;
                    VVar5 = ON::ViewSectionBehaviorFromUnsigned((uint)local_141);
                    this->m_section_behavior = VVar5;
                  }
                }
              }
            }
            goto LAB_003788f7;
          }
        }
LAB_00378937:
        bVar4 = false;
      }
    }
    else if (local_134 == 0x20008d3b) {
      bVar4 = ON_BinaryArchive::ReadObjectUserData(file,(ON_Object *)this);
    }
LAB_003788f7:
    bVar6 = ON_BinaryArchive::EndRead3dmChunk(file);
    if (!bVar6) {
      bVar4 = false;
    }
  } while (local_134 != 0xffffffff);
  bVar6 = ON_3dPoint::IsValid(&local_88);
  if (bVar6) {
    ON_Viewport::TargetPoint(&this->m_vp);
    bVar6 = ON_3dPoint::IsUnset(&local_70.m_min);
    if (bVar6) {
      target_point.y = local_88.y;
      target_point.x = local_88.x;
      target_point.z = local_88.z;
      ON_Viewport::SetTargetPoint(&this->m_vp,target_point);
    }
  }
  return bVar4;
}

Assistant:

bool ON_3dmView::Read( ON_BinaryArchive& file )
{
  // Everything in a view is in a subchunk so new records can 
  // be added to a view and old I/O code will still
  // work.
  ON_3dPoint obsolete_target_point = ON_3dPoint::UnsetPoint;
  unsigned int tcode = 0;
  ON__INT64 big_value = 0;
  int i32;
  bool rc = true;

  Default();

  while(rc) {
    rc = file.BeginRead3dmBigChunk(&tcode,&big_value);
    if (!rc)
      break;
    switch(tcode) 
    {
    case TCODE_VIEW_CPLANE:
      rc = m_cplane.Read(file);
      break;
    case TCODE_VIEW_VIEWPORT:
      rc = m_vp.Read(file)?true:false;
      break;
    case TCODE_VIEW_VIEWPORT_USERDATA:
      // 27 June 2008 Dale Lear
      //   I added support for saving userdata attached to
      //   the m_vp ON_Viewport.  Ideally, the ON_Viewport
      //   would be read by calling file.ReadObject(), but
      //   userdata support is being added years after 
      //   millions of files have been written by calling
      //   m_vp.Write()/Read().
      rc = file.ReadObjectUserData(m_vp);
      break;
    case TCODE_VIEW_SHOWCONGRID:
      m_bShowConstructionGrid = big_value?true:false;
      break;
    case TCODE_VIEW_SHOWCONAXES:
      m_bShowConstructionAxes = big_value?true:false;
      break;
    case TCODE_VIEW_SHOWWORLDAXES:
      m_bShowWorldAxes = big_value?true:false;
      break;
    case TCODE_VIEW_TRACEIMAGE:
      rc = m_trace_image.Read(file);
      break;
    case TCODE_VIEW_WALLPAPER:
      // used prior to 5 June 2003 and still written
      // after 5 June 2003 so older Rhinos/opennurbs
      // will not loose the filename information.
      {
        ON_wString bitmap_filename;
        rc = file.ReadString(bitmap_filename);
        m_wallpaper_image.m_image_file_reference.SetFullPath(bitmap_filename,false);
      }
      m_wallpaper_image.m_bGrayScale = true;
      break;
    case TCODE_VIEW_WALLPAPER_V3:
      // Added 5 June 2003 to support additional wallpaper attributes.
      rc = m_wallpaper_image.Read(file);
      break;
    case TCODE_VIEW_TARGET:
      // 13 June 2013
      // This point has been obsolete for more than 5 years 
      // and is now ignored.  The target point is on ON_Viewport.
      rc = file.ReadPoint(obsolete_target_point);
      break;
    case TCODE_VIEW_V3_DISPLAYMODE:
      if ( ON_nil_uuid == m_display_mode_id )
      {
        i32 = (int)big_value;
        ON::v3_display_mode dm = ON::V3DisplayMode(i32);
        m_display_mode_id = ON_StandardDisplayModeId::FromV3DisplayMode(dm);
      }
      break;
    case TCODE_VIEW_NAME:
      rc = file.ReadString(m_name);
      break;
    case TCODE_VIEW_POSITION:
      rc = m_position.Read(file);
      break;

    case TCODE_VIEW_ATTRIBUTES:
      {
        int major_version = 0;
        int minor_version = 0;
        rc = file.Read3dmChunkVersion(&major_version,&minor_version);
        // there are no 1.0 fields in this chunk
        while ( rc 
                && major_version == 1 && minor_version >= 1 
                && file.Archive3dmVersion() >= 4 
                && file.ArchiveOpenNURBSVersion() >= 200503170 )
        {
          // Added 23 March 2005 Dale Lear
          // 1.1 fields (there are no 1.0 fields)
          i32 = 0;
          rc = file.ReadInt( &i32 );
          if (!rc) break;
          m_view_type = ON::ViewType(i32);
          
          rc = file.ReadDouble( &m_page_settings.m_width_mm );
          if (!rc) break;

          rc = file.ReadDouble( &m_page_settings.m_height_mm );
          if (!rc) break;

          ON_UUID obsolete_parent_viewport_id;
          rc = file.ReadUuid( obsolete_parent_viewport_id );
          if (!rc) break;

          ON_BoundingBox obsolete_nested_view_position;
          rc = file.ReadBoundingBox( obsolete_nested_view_position );
          if (!rc) break;

          if ( minor_version >= 2 )
          {
            // 28 feb 2006 version 1.2 field
            rc = file.ReadUuid(m_display_mode_id);
            if (!rc) break;

            rc = m_page_settings.Read(file);
            if (!rc) break;

            if ( minor_version >= 3 )
            {
              rc = file.ReadBool(&m_bLockedProjection);
              if (!rc) break;

              if ( minor_version >= 4 )
              {
                rc = file.ReadArray(m_clipping_planes);
                if (!rc) break;
                if ( minor_version >= 5 )
                {
                  // 13 June 2013 version 1.5 field
                  rc = file.ReadUuid(m_named_view_id);
                  if (!rc) break;
                  if (minor_version >= 6)
                  {
                    // 8 Dec 2016 version 1.6 field (ALB)
                    rc = file.ReadBool(&m_bShowConstructionZAxis);
                    if (!rc) break;
                    if (minor_version >= 7)
                    {
                      // 11 May 2016 - Andy.  version 1.7 fields
                      rc = file.ReadDouble(&m_dFocalBlurDistance);
                      if (!rc) break;

                      rc = file.ReadDouble(&m_dFocalBlurAperture);
                      if (!rc) break;

                      rc = file.ReadDouble(&m_dFocalBlurJitter);
                      if (!rc) break;

                      rc = file.ReadInt((int*)&m_uFocalBlurSampleCount);
                      if (!rc) break;

                      rc = file.ReadInt((int*)&m_FocalBlurMode);
                      if (!rc) break;
                      if (minor_version >= 8)
                      {
                        // 4 August 2017 - Andy.  version 1.8 fields
                        rc = file.ReadInt(&m_sizeRendering.cx);
                        if (!rc) break;
                        rc = file.ReadInt(&m_sizeRendering.cy);
                        if (!rc) break;
                      }
                      if (minor_version >= 9)
                      {
                        // 9 July 2022 S. Baer add section behaviour
                        unsigned char c = 0;
                        rc = file.ReadChar(&c);
                        if (!rc) break;
                        SetSectionBehavior(ON::ViewSectionBehaviorFromUnsigned(c));
                      }
                    }
                  }
                }
              }
            }
          }

          // Add new information here - ask Dale Lear for help.

          break;
        }
      }
      break;
    }

    if (!file.EndRead3dmChunk())
      rc = false;
    if ( tcode == TCODE_ENDOFTABLE )
      break;
  }

  if ( obsolete_target_point.IsValid() && m_vp.TargetPoint().IsUnset() )
    m_vp.SetTargetPoint(obsolete_target_point);

  return rc;
}